

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O0

void __thiscall Rml::ElementDocument::ElementDocument(ElementDocument *this,String *tag)

{
  Property local_78;
  String *local_18;
  String *tag_local;
  ElementDocument *this_local;
  
  local_18 = tag;
  tag_local = (String *)this;
  Element::Element(&this->super_Element,tag);
  (this->super_Element).super_ScriptInterface.super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__ElementDocument_008166f0;
  ::std::__cxx11::string::string((string *)&this->title);
  ::std::__cxx11::string::string((string *)&this->source_url);
  ::std::shared_ptr<Rml::StyleSheetContainer>::shared_ptr(&this->style_sheet_container);
  this->context = (Context *)0x0;
  this->modal = false;
  this->focusable_from_modal = false;
  this->layout_dirty = true;
  this->position_dirty = false;
  Element::ForceLocalStackingContext(&this->super_Element);
  Element::SetOwnerDocument(&this->super_Element,this);
  Property::Property<Rml::Style::Position,Rml::Style::Position>(&local_78,Absolute);
  Element::SetProperty(&this->super_Element,Position,&local_78);
  Property::~Property(&local_78);
  return;
}

Assistant:

ElementDocument::ElementDocument(const String& tag) : Element(tag)
{
	context = nullptr;

	modal = false;
	focusable_from_modal = false;

	layout_dirty = true;
	position_dirty = false;

	ForceLocalStackingContext();
	SetOwnerDocument(this);

	SetProperty(PropertyId::Position, Property(Style::Position::Absolute));
}